

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

CURLcode file_setup_connection(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  FILEPROTO *pFVar2;
  
  pFVar2 = (FILEPROTO *)(*Curl_ccalloc)(1,0x18);
  (data->req).p.file = pFVar2;
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (pFVar2 != (FILEPROTO *)0x0) {
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode file_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  (void)conn;
  /* allocate the FILE specific struct */
  data->req.p.file = calloc(1, sizeof(struct FILEPROTO));
  if(!data->req.p.file)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}